

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ManInvertConstraints(Aig_Man_t *pAig)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar2 = pAig->nConstrs;
  if (iVar2 != 0) {
    iVar3 = pAig->nTruePos;
    if (0 < (long)iVar3) {
      pVVar5 = pAig->vCos;
      uVar4 = pVVar5->nSize;
      uVar8 = 0;
      uVar7 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar7 = uVar8;
      }
      do {
        if (uVar7 == uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if ((long)(iVar3 - iVar2) <= (long)uVar8) {
          pvVar6 = pVVar5->pArray[uVar8];
          if (((ulong)pvVar6 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x13c,"void Aig_ObjChild0Flip(Aig_Obj_t *)");
          }
          pbVar1 = (byte *)((long)pvVar6 + 8);
          *pbVar1 = *pbVar1 ^ 1;
        }
        uVar8 = uVar8 + 1;
      } while ((long)iVar3 != uVar8);
    }
  }
  return;
}

Assistant:

void Aig_ManInvertConstraints( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i;
    if ( Aig_ManConstrNum(pAig) == 0 )
        return;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i >= Saig_ManPoNum(pAig) - Aig_ManConstrNum(pAig) )
            Aig_ObjChild0Flip( pObj );
    }
}